

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.cpp
# Opt level: O0

void __thiscall
TrodesMsg::appendArg
          (TrodesMsg *this,char c,vector<unsigned_char,_std::allocator<unsigned_char>_> *a)

{
  zmsg_t *self;
  string *this_00;
  uchar *data;
  size_type size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  char in_SIL;
  long in_RDI;
  allocator local_19;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_18;
  
  if (in_SIL != 'b') {
    this_00 = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (this_00,"Could not append to msg. Expected a different type, got byte vector",
               &local_19);
    __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  self = *(zmsg_t **)(in_RDI + 0x20);
  local_18 = in_RDX;
  data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x216db1);
  size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_18);
  zmsg_addmem(self,data,size);
  return;
}

Assistant:

void TrodesMsg::appendArg (const char c, const std::vector<byte> &a){
    if(c != 'b') throw std::string(APPENDERROR "byte vector");
    zmsg_addmem(msg, a.data(), a.size());
}